

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageChannelValues * __thiscall
pbrt::Image::LookupNearest
          (ImageChannelValues *__return_storage_ptr__,Image *this,Point2f p,ImageChannelDesc *desc,
          WrapMode2D wrapMode)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  int i;
  ulong uVar3;
  Float FVar4;
  
  ImageChannelValues::ImageChannelValues(__return_storage_ptr__,(desc->offset).nStored,0.0);
  for (uVar3 = 0; uVar3 < (desc->offset).nStored; uVar3 = uVar3 + 1) {
    paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)(desc->offset).ptr;
    if (paVar1 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                   *)0x0) {
      paVar1 = &(desc->offset).field_2;
    }
    FVar4 = LookupNearestChannel(this,p,paVar1->fixed[uVar3],wrapMode);
    paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
              *)(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
    if (paVar2 == (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                   *)0x0) {
      paVar2 = &(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
    }
    paVar2->fixed[uVar3] = FVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::LookupNearest(Point2f p, const ImageChannelDesc &desc,
                                        WrapMode2D wrapMode) const {
    ImageChannelValues cv(desc.offset.size(), Float(0));
    for (int i = 0; i < desc.offset.size(); ++i)
        cv[i] = LookupNearestChannel(p, desc.offset[i], wrapMode);
    return cv;
}